

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::session_stats_header_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,session_stats_header_alert *this)

{
  long lVar1;
  pointer psVar2;
  bool bVar3;
  ulong uVar4;
  vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> *__range1;
  __normal_iterator<libtorrent::stats_metric_*,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
  __i;
  long lVar5;
  pointer psVar6;
  stats_metric *s;
  pointer psVar7;
  vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> stats;
  _Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"session stats header: ",(allocator<char> *)&local_38)
  ;
  session_stats_metrics();
  psVar2 = local_38._M_impl.super__Vector_impl_data._M_finish;
  psVar7 = local_38._M_impl.super__Vector_impl_data._M_start;
  if (local_38._M_impl.super__Vector_impl_data._M_start !=
      local_38._M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
            (long)local_38._M_impl.super__Vector_impl_data._M_start;
    uVar4 = lVar5 >> 4;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>>
              (local_38._M_impl.super__Vector_impl_data._M_start,
               local_38._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar5 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>>
                (psVar7,psVar2);
    }
    else {
      psVar6 = psVar7 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>>
                (psVar7,psVar6);
      for (; psVar6 != psVar2; psVar6 = psVar6 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>>
                  (psVar6);
      }
    }
  }
  bVar3 = true;
  for (psVar7 = local_38._M_impl.super__Vector_impl_data._M_start;
      psVar7 != local_38._M_impl.super__Vector_impl_data._M_finish; psVar7 = psVar7 + 1) {
    if (!bVar3) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    bVar3 = false;
  }
  std::_Vector_base<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>::
  ~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string session_stats_header_alert::message() const
	{
		std::string stats_header = "session stats header: ";
		std::vector<stats_metric> stats = session_stats_metrics();
		std::sort(stats.begin(), stats.end()
			, [] (stats_metric const& lhs, stats_metric const& rhs)
			{ return lhs.value_index < rhs.value_index; });
		bool first = true;
		for (auto const& s : stats)
		{
			if (!first) stats_header += ", ";
			stats_header += s.name;
			first = false;
		}

		return stats_header;
	}